

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateStateCheck(z_streamp strm)

{
  internal_state *piVar1;
  inflate_state *state;
  z_streamp strm_local;
  
  if (((strm == (z_streamp)0x0) || (strm->zalloc == (alloc_func)0x0)) ||
     (strm->zfree == (free_func)0x0)) {
    strm_local._4_4_ = 1;
  }
  else {
    piVar1 = strm->state;
    if (((piVar1 == (internal_state *)0x0) || (*(z_streamp *)piVar1 != strm)) ||
       ((*(uint *)(piVar1 + 8) < 0x3f34 || (0x3f53 < *(uint *)(piVar1 + 8))))) {
      strm_local._4_4_ = 1;
    }
    else {
      strm_local._4_4_ = 0;
    }
  }
  return strm_local._4_4_;
}

Assistant:

local int inflateStateCheck(z_streamp strm) {
    struct inflate_state FAR *state;
    if (strm == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0)
        return 1;
    state = (struct inflate_state FAR *)strm->state;
    if (state == Z_NULL || state->strm != strm ||
        state->mode < HEAD || state->mode > SYNC)
        return 1;
    return 0;
}